

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O3

void aom_highbd_lpf_horizontal_14_sse2
               (uint16_t *s,int pitch,uint8_t *blimit,uint8_t *limit,uint8_t *thresh,int bd)

{
  byte bVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined8 uVar23;
  undefined1 auVar24 [16];
  undefined8 uVar25;
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  long lVar35;
  uint16_t *puVar36;
  ulong uVar37;
  uint16_t *puVar38;
  long lVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  short sVar47;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  undefined1 auVar48 [16];
  short sVar55;
  short sVar56;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  short sVar65;
  undefined1 auVar66 [16];
  short sVar68;
  short sVar69;
  short sVar70;
  undefined1 auVar67 [16];
  short sVar71;
  undefined1 auVar72 [16];
  ushort uVar73;
  short sVar74;
  ushort uVar77;
  short sVar78;
  ushort uVar79;
  short sVar80;
  ushort uVar81;
  short sVar82;
  ushort uVar83;
  short sVar84;
  ushort uVar85;
  short sVar86;
  ushort uVar87;
  short sVar88;
  undefined1 auVar75 [16];
  ushort uVar89;
  undefined1 auVar76 [16];
  short sVar90;
  undefined4 uVar91;
  undefined4 uVar96;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  short sVar103;
  short sVar104;
  short sVar106;
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  undefined1 auVar105 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  short sVar118;
  short sVar121;
  short sVar122;
  short sVar123;
  short sVar124;
  short sVar125;
  short sVar126;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  short sVar127;
  __m128i flat_pq [3];
  __m128i q [7];
  __m128i p [7];
  short local_268;
  short sStack_266;
  short sStack_264;
  short sStack_262;
  short sStack_260;
  short sStack_25e;
  short sStack_25c;
  short sStack_25a;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  short local_248;
  short sStack_246;
  short sStack_244;
  short sStack_242;
  short sStack_240;
  short sStack_23e;
  short sStack_23c;
  short sStack_23a;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  short local_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  undefined2 uStack_1e0;
  undefined2 uStack_1de;
  undefined2 uStack_1dc;
  undefined2 uStack_1da;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short local_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  undefined2 uStack_1c0;
  undefined2 uStack_1be;
  undefined2 uStack_1bc;
  undefined2 uStack_1ba;
  undefined1 local_1b8 [16];
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  undefined2 uStack_1a0;
  undefined2 uStack_19e;
  undefined2 uStack_19c;
  undefined2 uStack_19a;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  undefined1 local_188 [16];
  ushort local_178;
  ushort uStack_176;
  ushort uStack_174;
  ushort uStack_172;
  ushort uStack_170;
  ushort uStack_16e;
  ushort uStack_16c;
  ushort uStack_16a;
  ushort local_168;
  ushort uStack_166;
  ushort uStack_164;
  ushort uStack_162;
  ushort uStack_160;
  ushort uStack_15e;
  ushort uStack_15c;
  ushort uStack_15a;
  ushort local_158;
  ushort uStack_156;
  ushort uStack_154;
  ushort uStack_152;
  ushort uStack_150;
  ushort uStack_14e;
  ushort uStack_14c;
  ushort uStack_14a;
  ushort local_148;
  ushort uStack_146;
  ushort uStack_144;
  ushort uStack_142;
  ushort uStack_140;
  ushort uStack_13e;
  ushort uStack_13c;
  ushort uStack_13a;
  ushort local_138;
  ushort uStack_136;
  ushort uStack_134;
  ushort uStack_132;
  ushort uStack_130;
  ushort uStack_12e;
  ushort uStack_12c;
  ushort uStack_12a;
  ushort local_128;
  ushort uStack_126;
  ushort uStack_124;
  ushort uStack_122;
  ushort uStack_120;
  ushort uStack_11e;
  ushort uStack_11c;
  ushort uStack_11a;
  ushort local_118;
  ushort uStack_116;
  ushort uStack_114;
  ushort uStack_112;
  ushort uStack_110;
  ushort uStack_10e;
  ushort uStack_10c;
  ushort uStack_10a;
  ushort local_108;
  ushort uStack_106;
  ushort uStack_104;
  ushort uStack_102;
  ushort uStack_100;
  ushort uStack_fe;
  ushort uStack_fc;
  ushort uStack_fa;
  ushort local_f8;
  ushort uStack_f6;
  ushort uStack_f4;
  ushort uStack_f2;
  ushort uStack_f0;
  ushort uStack_ee;
  ushort uStack_ec;
  ushort uStack_ea;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  undefined8 uStack_e0;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  undefined2 uStack_d0;
  undefined2 uStack_ce;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  undefined2 uStack_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  undefined8 uStack_78;
  __m128i pq [7];
  
  lVar35 = (long)pitch;
  puVar38 = s + -lVar35;
  lVar39 = 0;
  puVar36 = s;
  do {
    *(undefined8 *)((long)pq[-1] + lVar39 + 8) = *(undefined8 *)puVar38;
    *(undefined8 *)((long)pq[0] + lVar39) = 0;
    *(undefined8 *)((long)&local_e8 + lVar39) = *(undefined8 *)puVar36;
    *(undefined8 *)((long)&uStack_e0 + lVar39) = 0;
    puVar38 = puVar38 + -lVar35;
    puVar36 = puVar36 + lVar35;
    lVar39 = lVar39 + 0x10;
  } while (lVar39 != 0x70);
  auVar57 = *(undefined1 (*) [16])blimit;
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar57._0_13_;
  auVar2[0xe] = auVar57[7];
  auVar5[0xc] = auVar57[6];
  auVar5._0_12_ = auVar57._0_12_;
  auVar5._13_2_ = auVar2._13_2_;
  auVar8[0xb] = 0;
  auVar8._0_11_ = auVar57._0_11_;
  auVar8._12_3_ = auVar5._12_3_;
  auVar11[10] = auVar57[5];
  auVar11._0_10_ = auVar57._0_10_;
  auVar11._11_4_ = auVar8._11_4_;
  auVar14[9] = 0;
  auVar14._0_9_ = auVar57._0_9_;
  auVar14._10_5_ = auVar11._10_5_;
  auVar17[8] = auVar57[4];
  auVar17._0_8_ = auVar57._0_8_;
  auVar17._9_6_ = auVar14._9_6_;
  auVar26._7_8_ = 0;
  auVar26._0_7_ = auVar17._8_7_;
  auVar29._1_8_ = SUB158(auVar26 << 0x40,7);
  auVar29[0] = auVar57[3];
  auVar29._9_6_ = 0;
  auVar30._1_10_ = SUB1510(auVar29 << 0x30,5);
  auVar30[0] = auVar57[2];
  auVar30._11_4_ = 0;
  auVar20[2] = auVar57[1];
  auVar20._0_2_ = auVar57._0_2_;
  auVar20._3_12_ = SUB1512(auVar30 << 0x20,3);
  auVar72._0_2_ = auVar57._0_2_ & 0xff;
  auVar72._2_13_ = auVar20._2_13_;
  auVar72[0xf] = 0;
  auVar57 = *(undefined1 (*) [16])limit;
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar57._0_13_;
  auVar3[0xe] = auVar57[7];
  auVar6[0xc] = auVar57[6];
  auVar6._0_12_ = auVar57._0_12_;
  auVar6._13_2_ = auVar3._13_2_;
  auVar9[0xb] = 0;
  auVar9._0_11_ = auVar57._0_11_;
  auVar9._12_3_ = auVar6._12_3_;
  auVar12[10] = auVar57[5];
  auVar12._0_10_ = auVar57._0_10_;
  auVar12._11_4_ = auVar9._11_4_;
  auVar15[9] = 0;
  auVar15._0_9_ = auVar57._0_9_;
  auVar15._10_5_ = auVar12._10_5_;
  auVar18[8] = auVar57[4];
  auVar18._0_8_ = auVar57._0_8_;
  auVar18._9_6_ = auVar15._9_6_;
  auVar27._7_8_ = 0;
  auVar27._0_7_ = auVar18._8_7_;
  auVar31._1_8_ = SUB158(auVar27 << 0x40,7);
  auVar31[0] = auVar57[3];
  auVar31._9_6_ = 0;
  auVar32._1_10_ = SUB1510(auVar31 << 0x30,5);
  auVar32[0] = auVar57[2];
  auVar32._11_4_ = 0;
  auVar21[2] = auVar57[1];
  auVar21._0_2_ = auVar57._0_2_;
  auVar21._3_12_ = SUB1512(auVar32 << 0x20,3);
  auVar43._0_2_ = auVar57._0_2_ & 0xff;
  auVar43._2_13_ = auVar21._2_13_;
  auVar43[0xf] = 0;
  bVar1 = (char)bd - 1U & 0x1f;
  auVar57 = *(undefined1 (*) [16])thresh;
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar57._0_13_;
  auVar4[0xe] = auVar57[7];
  auVar7[0xc] = auVar57[6];
  auVar7._0_12_ = auVar57._0_12_;
  auVar7._13_2_ = auVar4._13_2_;
  auVar10[0xb] = 0;
  auVar10._0_11_ = auVar57._0_11_;
  auVar10._12_3_ = auVar7._12_3_;
  auVar13[10] = auVar57[5];
  auVar13._0_10_ = auVar57._0_10_;
  auVar13._11_4_ = auVar10._11_4_;
  auVar16[9] = 0;
  auVar16._0_9_ = auVar57._0_9_;
  auVar16._10_5_ = auVar13._10_5_;
  auVar19[8] = auVar57[4];
  auVar19._0_8_ = auVar57._0_8_;
  auVar19._9_6_ = auVar16._9_6_;
  auVar28._7_8_ = 0;
  auVar28._0_7_ = auVar19._8_7_;
  auVar33._1_8_ = SUB158(auVar28 << 0x40,7);
  auVar33[0] = auVar57[3];
  auVar33._9_6_ = 0;
  auVar34._1_10_ = SUB1510(auVar33 << 0x30,5);
  auVar34[0] = auVar57[2];
  auVar34._11_4_ = 0;
  auVar22[2] = auVar57[1];
  auVar22._0_2_ = auVar57._0_2_;
  auVar22._3_12_ = SUB1512(auVar34 << 0x20,3);
  auVar92._0_2_ = auVar57._0_2_ & 0xff;
  auVar92._2_13_ = auVar22._2_13_;
  auVar92[0xf] = 0;
  auVar57 = ZEXT416((uint)(1 << bVar1));
  lVar39 = 0;
  do {
    *(undefined8 *)((long)&local_258 + lVar39) = *(undefined8 *)((long)pq[-1] + lVar39 + 8);
    *(undefined8 *)((long)&sStack_250 + lVar39) = *(undefined8 *)((long)&local_e8 + lVar39);
    lVar39 = lVar39 + 0x10;
  } while (lVar39 != 0x70);
  auVar46 = ZEXT416(bd - 8);
  auVar75 = psllw(auVar72,auVar46);
  auVar43 = psllw(auVar43,auVar46);
  auVar72 = psllw(auVar92,auVar46);
  uVar23 = CONCAT26(sStack_252,CONCAT24(sStack_254,CONCAT22(sStack_256,local_258)));
  auVar24._8_2_ = sStack_250;
  auVar24._0_8_ = uVar23;
  auVar24._10_2_ = sStack_24e;
  auVar24._12_2_ = sStack_24c;
  auVar24._14_2_ = sStack_24a;
  uVar25 = CONCAT26(sStack_242,CONCAT24(sStack_244,CONCAT22(sStack_246,local_248)));
  auVar105._8_2_ = sStack_240;
  auVar105._0_8_ = uVar25;
  auVar105._10_2_ = sStack_23e;
  auVar105._12_2_ = sStack_23c;
  auVar105._14_2_ = sStack_23a;
  auVar48._8_8_ = uVar25;
  auVar48._0_8_ = uVar23;
  auVar40._8_8_ = auVar105._8_8_;
  auVar40._0_8_ = auVar24._8_8_;
  auVar92 = psubusw(auVar48,auVar40);
  auVar97 = psubusw(auVar40,auVar48);
  auVar97 = auVar97 | auVar92;
  auVar92 = paddusw(auVar97,auVar97);
  auVar93._0_8_ = auVar92._0_8_;
  auVar93._8_8_ = 0;
  auVar98._0_2_ = auVar97._8_2_ >> 1;
  auVar98._2_2_ = auVar97._10_2_ >> 1;
  auVar98._4_2_ = auVar97._12_2_ >> 1;
  auVar98._6_2_ = auVar97._14_2_ >> 1;
  auVar98._8_8_ = 0;
  auVar92 = paddusw(auVar98,auVar93);
  auVar92 = auVar92 ^ _DAT_004d28e0;
  auVar75 = auVar75 ^ _DAT_004d28e0;
  auVar99._0_2_ = -(ushort)(auVar75._0_2_ < auVar92._0_2_);
  auVar99._2_2_ = -(ushort)(auVar75._2_2_ < auVar92._2_2_);
  auVar99._4_2_ = -(ushort)(auVar75._4_2_ < auVar92._4_2_);
  auVar99._6_2_ = -(ushort)(auVar75._6_2_ < auVar92._6_2_);
  auVar99._8_2_ = -(ushort)(auVar75._8_2_ < auVar92._8_2_);
  auVar99._10_2_ = -(ushort)(auVar75._10_2_ < auVar92._10_2_);
  auVar99._12_2_ = -(ushort)(auVar75._12_2_ < auVar92._12_2_);
  auVar99._14_2_ = -(ushort)(auVar75._14_2_ < auVar92._14_2_);
  auVar75 = paddusw(_DAT_0050d500,auVar43);
  auVar75 = auVar75 & auVar99;
  auVar93 = psubusw(auVar24,auVar105);
  auVar92 = psubusw(auVar105,auVar24);
  auVar92 = auVar92 | auVar93;
  sVar52 = auVar92._0_2_;
  sVar59 = auVar92._8_2_;
  auVar97._0_2_ = (ushort)(sVar59 < sVar52) * sVar52 | (ushort)(sVar59 >= sVar52) * sVar59;
  sVar53 = auVar92._2_2_;
  sVar60 = auVar92._10_2_;
  auVar97._2_2_ = (ushort)(sVar60 < sVar53) * sVar53 | (ushort)(sVar60 >= sVar53) * sVar60;
  sVar54 = auVar92._4_2_;
  sVar61 = auVar92._12_2_;
  auVar97._4_2_ = (ushort)(sVar61 < sVar54) * sVar54 | (ushort)(sVar61 >= sVar54) * sVar61;
  sVar55 = auVar92._6_2_;
  sVar62 = auVar92._14_2_;
  auVar97._6_2_ = (ushort)(sVar62 < sVar55) * sVar55 | (ushort)(sVar62 >= sVar55) * sVar62;
  sVar49 = (ushort)(0 < sVar59) * sVar59;
  auVar97._8_2_ = sVar49;
  sVar47 = (ushort)(0 < sVar60) * sVar60;
  auVar97._10_2_ = sVar47;
  sVar50 = (ushort)(0 < sVar61) * sVar61;
  auVar97._12_2_ = sVar50;
  sVar51 = (ushort)(0 < sVar62) * sVar62;
  auVar97._14_2_ = sVar51;
  sVar56 = auVar75._0_2_;
  uVar73 = (sVar56 < (short)auVar97._0_2_) * auVar97._0_2_ |
           (ushort)(sVar56 >= (short)auVar97._0_2_) * sVar56;
  sVar56 = auVar75._2_2_;
  uVar77 = (sVar56 < (short)auVar97._2_2_) * auVar97._2_2_ |
           (ushort)(sVar56 >= (short)auVar97._2_2_) * sVar56;
  sVar56 = auVar75._4_2_;
  uVar79 = (sVar56 < (short)auVar97._4_2_) * auVar97._4_2_ |
           (ushort)(sVar56 >= (short)auVar97._4_2_) * sVar56;
  sVar56 = auVar75._6_2_;
  uVar81 = (sVar56 < (short)auVar97._6_2_) * auVar97._6_2_ |
           (ushort)(sVar56 >= (short)auVar97._6_2_) * sVar56;
  sVar56 = auVar75._8_2_;
  uVar83 = (ushort)(sVar56 < sVar49) * sVar49 | (ushort)(sVar56 >= sVar49) * sVar56;
  sVar49 = auVar75._10_2_;
  uVar85 = (ushort)(sVar49 < sVar47) * sVar47 | (ushort)(sVar49 >= sVar47) * sVar49;
  sVar47 = auVar75._12_2_;
  sVar49 = auVar75._14_2_;
  uVar87 = (ushort)(sVar47 < sVar50) * sVar50 | (ushort)(sVar47 >= sVar50) * sVar47;
  uVar89 = (ushort)(sVar49 < sVar51) * sVar51 | (ushort)(sVar49 >= sVar51) * sVar49;
  auVar97 = auVar97 ^ _DAT_004d28e0;
  auVar72 = auVar72 ^ _DAT_004d28e0;
  uVar91 = CONCAT22(-(ushort)(auVar72._2_2_ < auVar97._2_2_),
                    -(ushort)(auVar72._0_2_ < auVar97._0_2_));
  lVar39 = 0x20;
  do {
    auVar105 = psubusw(*(undefined1 (*) [16])((long)&local_258 + lVar39),
                       *(undefined1 (*) [16])((long)&local_268 + lVar39));
    auVar92 = psubusw(*(undefined1 (*) [16])((long)&local_268 + lVar39),
                      *(undefined1 (*) [16])((long)&local_258 + lVar39));
    auVar92 = auVar92 | auVar105;
    sVar47 = auVar92._0_2_;
    uVar73 = (ushort)((short)uVar73 < sVar47) * sVar47 | ((short)uVar73 >= sVar47) * uVar73;
    sVar47 = auVar92._2_2_;
    uVar77 = (ushort)((short)uVar77 < sVar47) * sVar47 | ((short)uVar77 >= sVar47) * uVar77;
    sVar47 = auVar92._4_2_;
    uVar79 = (ushort)((short)uVar79 < sVar47) * sVar47 | ((short)uVar79 >= sVar47) * uVar79;
    sVar47 = auVar92._6_2_;
    uVar81 = (ushort)((short)uVar81 < sVar47) * sVar47 | ((short)uVar81 >= sVar47) * uVar81;
    sVar47 = auVar92._8_2_;
    uVar83 = (ushort)((short)uVar83 < sVar47) * sVar47 | ((short)uVar83 >= sVar47) * uVar83;
    sVar47 = auVar92._10_2_;
    uVar85 = (ushort)((short)uVar85 < sVar47) * sVar47 | ((short)uVar85 >= sVar47) * uVar85;
    sVar47 = auVar92._12_2_;
    uVar87 = (ushort)((short)uVar87 < sVar47) * sVar47 | ((short)uVar87 >= sVar47) * uVar87;
    sVar47 = auVar92._14_2_;
    uVar89 = (ushort)((short)uVar89 < sVar47) * sVar47 | ((short)uVar89 >= sVar47) * uVar89;
    lVar39 = lVar39 + 0x10;
  } while (lVar39 != 0x40);
  auVar57 = pshuflw(auVar57,auVar57,0);
  auVar58._0_4_ = auVar57._0_4_;
  auVar58._4_4_ = auVar58._0_4_;
  auVar58._8_4_ = auVar58._0_4_;
  auVar58._12_4_ = auVar58._0_4_;
  uVar96 = (undefined4)
           (CONCAT26(-(ushort)(auVar72._6_2_ < auVar97._6_2_),
                     CONCAT24(-(ushort)(auVar72._4_2_ < auVar97._4_2_),uVar91)) >> 0x20);
  auVar100._4_4_ = uVar96;
  auVar100._0_4_ = uVar91;
  auVar100._8_4_ = uVar91;
  auVar100._12_4_ = uVar96;
  auVar94._0_2_ =
       ((short)uVar83 < (short)uVar73) * uVar73 | ((short)uVar83 >= (short)uVar73) * uVar83;
  auVar94._2_2_ =
       ((short)uVar85 < (short)uVar77) * uVar77 | ((short)uVar85 >= (short)uVar77) * uVar85;
  auVar94._4_2_ =
       ((short)uVar87 < (short)uVar79) * uVar79 | ((short)uVar87 >= (short)uVar79) * uVar87;
  auVar94._6_2_ =
       ((short)uVar89 < (short)uVar81) * uVar81 | ((short)uVar89 >= (short)uVar81) * uVar89;
  auVar94._8_2_ = (0 < (short)uVar83) * uVar83;
  auVar94._10_2_ = (0 < (short)uVar85) * uVar85;
  auVar94._12_2_ = (0 < (short)uVar87) * uVar87;
  auVar94._14_2_ = (0 < (short)uVar89) * uVar89;
  auVar57 = psubusw(auVar94,auVar43);
  auVar95._0_2_ = -(ushort)(auVar57._0_2_ == 0);
  auVar95._2_2_ = -(ushort)(auVar57._2_2_ == 0);
  auVar95._4_2_ = -(ushort)(auVar57._4_2_ == 0);
  auVar95._6_2_ = -(ushort)(auVar57._6_2_ == 0);
  auVar95._8_2_ = -(ushort)(auVar57._8_2_ == 0);
  auVar95._10_2_ = -(ushort)(auVar57._10_2_ == 0);
  auVar95._12_2_ = -(ushort)(auVar57._12_2_ == 0);
  auVar95._14_2_ = -(ushort)(auVar57._14_2_ == 0);
  auVar57 = psllw(_DAT_0050d500,ZEXT416((uint)bd));
  auVar75._8_4_ = 0xffffffff;
  auVar75._0_8_ = 0xffffffffffffffff;
  auVar75._12_4_ = 0xffffffff;
  auVar57 = paddsw(auVar57,auVar75);
  auVar92 = psubsw(auVar57,auVar58);
  auVar72 = psubsw((undefined1  [16])0x0,auVar58);
  auVar43 = psubsw(auVar48,auVar58);
  auVar57 = psubsw(auVar40,auVar58);
  auVar105 = psubsw(auVar43,auVar57);
  sVar103 = auVar92._0_2_;
  sVar47 = auVar105._0_2_;
  uVar73 = (ushort)(sVar103 < sVar47) * sVar103 | (ushort)(sVar103 >= sVar47) * sVar47;
  sVar106 = auVar92._2_2_;
  sVar47 = auVar105._2_2_;
  uVar77 = (ushort)(sVar106 < sVar47) * sVar106 | (ushort)(sVar106 >= sVar47) * sVar47;
  sVar108 = auVar92._4_2_;
  sVar47 = auVar105._4_2_;
  uVar79 = (ushort)(sVar108 < sVar47) * sVar108 | (ushort)(sVar108 >= sVar47) * sVar47;
  sVar110 = auVar92._6_2_;
  sVar47 = auVar105._6_2_;
  uVar81 = (ushort)(sVar110 < sVar47) * sVar110 | (ushort)(sVar110 >= sVar47) * sVar47;
  sVar118 = auVar92._8_2_;
  sVar47 = auVar105._8_2_;
  uVar83 = (ushort)(sVar118 < sVar47) * sVar118 | (ushort)(sVar118 >= sVar47) * sVar47;
  sVar121 = auVar92._10_2_;
  sVar47 = auVar105._10_2_;
  uVar85 = (ushort)(sVar121 < sVar47) * sVar121 | (ushort)(sVar121 >= sVar47) * sVar47;
  sVar122 = auVar92._12_2_;
  sVar47 = auVar105._12_2_;
  sVar49 = auVar105._14_2_;
  uVar87 = (ushort)(sVar122 < sVar47) * sVar122 | (ushort)(sVar122 >= sVar47) * sVar47;
  sVar123 = auVar92._14_2_;
  uVar89 = (ushort)(sVar123 < sVar49) * sVar123 | (ushort)(sVar123 >= sVar49) * sVar49;
  sVar47 = auVar72._0_2_;
  auVar114._0_2_ = (ushort)((short)uVar73 < sVar47) * sVar47 | ((short)uVar73 >= sVar47) * uVar73;
  sVar49 = auVar72._2_2_;
  auVar114._2_2_ = (ushort)((short)uVar77 < sVar49) * sVar49 | ((short)uVar77 >= sVar49) * uVar77;
  sVar50 = auVar72._4_2_;
  auVar114._4_2_ = (ushort)((short)uVar79 < sVar50) * sVar50 | ((short)uVar79 >= sVar50) * uVar79;
  sVar51 = auVar72._6_2_;
  auVar114._6_2_ = (ushort)((short)uVar81 < sVar51) * sVar51 | ((short)uVar81 >= sVar51) * uVar81;
  sVar56 = auVar72._8_2_;
  auVar114._8_2_ = (ushort)((short)uVar83 < sVar56) * sVar56 | ((short)uVar83 >= sVar56) * uVar83;
  sVar63 = auVar72._10_2_;
  auVar114._10_2_ = (ushort)((short)uVar85 < sVar63) * sVar63 | ((short)uVar85 >= sVar63) * uVar85;
  sVar64 = auVar72._12_2_;
  auVar114._12_2_ = (ushort)((short)uVar87 < sVar64) * sVar64 | ((short)uVar87 >= sVar64) * uVar87;
  sVar65 = auVar72._14_2_;
  auVar114._14_2_ = (ushort)((short)uVar89 < sVar65) * sVar65 | ((short)uVar89 >= sVar65) * uVar89;
  auVar92 = psubsw(auVar114 >> 0x40 & auVar100,auVar114);
  auVar92 = psubsw(auVar92,auVar114);
  auVar92 = psubsw(auVar92,auVar114);
  sVar124 = auVar92._0_2_;
  uVar73 = (ushort)(sVar103 < sVar124) * sVar103 | (ushort)(sVar103 >= sVar124) * sVar124;
  sVar124 = auVar92._2_2_;
  uVar77 = (ushort)(sVar106 < sVar124) * sVar106 | (ushort)(sVar106 >= sVar124) * sVar124;
  sVar124 = auVar92._4_2_;
  uVar79 = (ushort)(sVar108 < sVar124) * sVar108 | (ushort)(sVar108 >= sVar124) * sVar124;
  sVar124 = auVar92._6_2_;
  uVar81 = (ushort)(sVar110 < sVar124) * sVar110 | (ushort)(sVar110 >= sVar124) * sVar124;
  sVar124 = auVar92._8_2_;
  uVar83 = (ushort)(sVar118 < sVar124) * sVar118 | (ushort)(sVar118 >= sVar124) * sVar124;
  sVar124 = auVar92._10_2_;
  uVar85 = (ushort)(sVar121 < sVar124) * sVar121 | (ushort)(sVar121 >= sVar124) * sVar124;
  sVar124 = auVar92._12_2_;
  sVar125 = auVar92._14_2_;
  uVar87 = (ushort)(sVar122 < sVar124) * sVar122 | (ushort)(sVar122 >= sVar124) * sVar124;
  uVar89 = (ushort)(sVar123 < sVar125) * sVar123 | (ushort)(sVar123 >= sVar125) * sVar125;
  auVar119._0_2_ = (ushort)((short)uVar73 < sVar47) * sVar47 | ((short)uVar73 >= sVar47) * uVar73;
  auVar119._2_2_ = (ushort)((short)uVar77 < sVar49) * sVar49 | ((short)uVar77 >= sVar49) * uVar77;
  auVar119._4_2_ = (ushort)((short)uVar79 < sVar50) * sVar50 | ((short)uVar79 >= sVar50) * uVar79;
  auVar119._6_2_ = (ushort)((short)uVar81 < sVar51) * sVar51 | ((short)uVar81 >= sVar51) * uVar81;
  auVar119._8_2_ = (ushort)((short)uVar83 < sVar56) * sVar56 | ((short)uVar83 >= sVar56) * uVar83;
  auVar119._10_2_ = (ushort)((short)uVar85 < sVar63) * sVar63 | ((short)uVar85 >= sVar63) * uVar85;
  auVar119._12_2_ = (ushort)((short)uVar87 < sVar64) * sVar64 | ((short)uVar87 >= sVar64) * uVar87;
  auVar119._14_2_ = (ushort)((short)uVar89 < sVar65) * sVar65 | ((short)uVar89 >= sVar65) * uVar89;
  auVar119 = auVar119 & auVar95;
  auVar115._0_8_ = auVar119._0_8_;
  auVar115._8_4_ = auVar119._0_4_;
  auVar115._12_4_ = auVar119._4_4_;
  auVar92 = paddsw(auVar115,_DAT_0050d510);
  sVar124 = auVar92._0_2_;
  uVar73 = (ushort)(sVar103 < sVar124) * sVar103 | (ushort)(sVar103 >= sVar124) * sVar124;
  sVar124 = auVar92._2_2_;
  uVar77 = (ushort)(sVar106 < sVar124) * sVar106 | (ushort)(sVar106 >= sVar124) * sVar124;
  sVar124 = auVar92._4_2_;
  uVar79 = (ushort)(sVar108 < sVar124) * sVar108 | (ushort)(sVar108 >= sVar124) * sVar124;
  sVar124 = auVar92._6_2_;
  uVar81 = (ushort)(sVar110 < sVar124) * sVar110 | (ushort)(sVar110 >= sVar124) * sVar124;
  sVar124 = auVar92._8_2_;
  uVar83 = (ushort)(sVar118 < sVar124) * sVar118 | (ushort)(sVar118 >= sVar124) * sVar124;
  sVar124 = auVar92._10_2_;
  uVar85 = (ushort)(sVar121 < sVar124) * sVar121 | (ushort)(sVar121 >= sVar124) * sVar124;
  sVar124 = auVar92._12_2_;
  sVar125 = auVar92._14_2_;
  uVar87 = (ushort)(sVar122 < sVar124) * sVar122 | (ushort)(sVar122 >= sVar124) * sVar124;
  uVar89 = (ushort)(sVar123 < sVar125) * sVar123 | (ushort)(sVar123 >= sVar125) * sVar125;
  auVar116._0_2_ = (ushort)((short)uVar73 < sVar47) * sVar47 | ((short)uVar73 >= sVar47) * uVar73;
  auVar116._2_2_ = (ushort)((short)uVar77 < sVar49) * sVar49 | ((short)uVar77 >= sVar49) * uVar77;
  auVar116._4_2_ = (ushort)((short)uVar79 < sVar50) * sVar50 | ((short)uVar79 >= sVar50) * uVar79;
  auVar116._6_2_ = (ushort)((short)uVar81 < sVar51) * sVar51 | ((short)uVar81 >= sVar51) * uVar81;
  auVar116._8_2_ = (ushort)((short)uVar83 < sVar56) * sVar56 | ((short)uVar83 >= sVar56) * uVar83;
  auVar116._10_2_ = (ushort)((short)uVar85 < sVar63) * sVar63 | ((short)uVar85 >= sVar63) * uVar85;
  auVar116._12_2_ = (ushort)((short)uVar87 < sVar64) * sVar64 | ((short)uVar87 >= sVar64) * uVar87;
  auVar116._14_2_ = (ushort)((short)uVar89 < sVar65) * sVar65 | ((short)uVar89 >= sVar65) * uVar89;
  auVar92 = psraw(auVar116,3);
  auVar120._0_2_ = auVar92._0_2_ + 1;
  auVar120._2_2_ = auVar92._2_2_ + 1;
  auVar120._4_2_ = auVar92._4_2_ + 1;
  auVar120._6_2_ = auVar92._6_2_ + 1;
  auVar120._8_2_ = auVar92._0_2_ + 1;
  auVar120._10_2_ = auVar92._2_2_ + 1;
  auVar120._12_2_ = auVar92._4_2_ + 1;
  auVar120._14_2_ = auVar92._6_2_ + 1;
  auVar72 = psraw(auVar120,1);
  auVar44._8_8_ = SUB168(~auVar100 & auVar72,8);
  auVar44._0_8_ = auVar92._8_8_;
  auVar117._8_8_ = SUB168(~auVar100 & auVar72,0);
  auVar117._0_8_ = auVar92._0_8_;
  auVar57 = psubsw(auVar57,auVar117);
  auVar43 = paddsw(auVar44,auVar43);
  sVar124 = auVar57._0_2_;
  uVar73 = (ushort)(sVar103 < sVar124) * sVar103 | (ushort)(sVar103 >= sVar124) * sVar124;
  sVar124 = auVar57._2_2_;
  uVar77 = (ushort)(sVar106 < sVar124) * sVar106 | (ushort)(sVar106 >= sVar124) * sVar124;
  sVar124 = auVar57._4_2_;
  uVar79 = (ushort)(sVar108 < sVar124) * sVar108 | (ushort)(sVar108 >= sVar124) * sVar124;
  sVar124 = auVar57._6_2_;
  uVar81 = (ushort)(sVar110 < sVar124) * sVar110 | (ushort)(sVar110 >= sVar124) * sVar124;
  sVar124 = auVar57._8_2_;
  uVar83 = (ushort)(sVar118 < sVar124) * sVar118 | (ushort)(sVar118 >= sVar124) * sVar124;
  sVar124 = auVar57._10_2_;
  uVar85 = (ushort)(sVar121 < sVar124) * sVar121 | (ushort)(sVar121 >= sVar124) * sVar124;
  sVar124 = auVar57._12_2_;
  sVar125 = auVar57._14_2_;
  uVar87 = (ushort)(sVar122 < sVar124) * sVar122 | (ushort)(sVar122 >= sVar124) * sVar124;
  uVar89 = (ushort)(sVar123 < sVar125) * sVar123 | (ushort)(sVar123 >= sVar125) * sVar125;
  auVar57._0_2_ = (ushort)((short)uVar73 < sVar47) * sVar47 | ((short)uVar73 >= sVar47) * uVar73;
  auVar57._2_2_ = (ushort)((short)uVar77 < sVar49) * sVar49 | ((short)uVar77 >= sVar49) * uVar77;
  auVar57._4_2_ = (ushort)((short)uVar79 < sVar50) * sVar50 | ((short)uVar79 >= sVar50) * uVar79;
  auVar57._6_2_ = (ushort)((short)uVar81 < sVar51) * sVar51 | ((short)uVar81 >= sVar51) * uVar81;
  auVar57._8_2_ = (ushort)((short)uVar83 < sVar56) * sVar56 | ((short)uVar83 >= sVar56) * uVar83;
  auVar57._10_2_ = (ushort)((short)uVar85 < sVar63) * sVar63 | ((short)uVar85 >= sVar63) * uVar85;
  auVar57._12_2_ = (ushort)((short)uVar87 < sVar64) * sVar64 | ((short)uVar87 >= sVar64) * uVar87;
  auVar57._14_2_ = (ushort)((short)uVar89 < sVar65) * sVar65 | ((short)uVar89 >= sVar65) * uVar89;
  sVar124 = auVar43._0_2_;
  uVar73 = (ushort)(sVar103 < sVar124) * sVar103 | (ushort)(sVar103 >= sVar124) * sVar124;
  sVar103 = auVar43._2_2_;
  uVar77 = (ushort)(sVar106 < sVar103) * sVar106 | (ushort)(sVar106 >= sVar103) * sVar103;
  sVar103 = auVar43._4_2_;
  uVar79 = (ushort)(sVar108 < sVar103) * sVar108 | (ushort)(sVar108 >= sVar103) * sVar103;
  sVar103 = auVar43._6_2_;
  uVar81 = (ushort)(sVar110 < sVar103) * sVar110 | (ushort)(sVar110 >= sVar103) * sVar103;
  sVar103 = auVar43._8_2_;
  uVar83 = (ushort)(sVar118 < sVar103) * sVar118 | (ushort)(sVar118 >= sVar103) * sVar103;
  sVar103 = auVar43._10_2_;
  uVar85 = (ushort)(sVar121 < sVar103) * sVar121 | (ushort)(sVar121 >= sVar103) * sVar103;
  sVar103 = auVar43._12_2_;
  sVar106 = auVar43._14_2_;
  uVar87 = (ushort)(sVar122 < sVar103) * sVar122 | (ushort)(sVar122 >= sVar103) * sVar103;
  uVar89 = (ushort)(sVar123 < sVar106) * sVar123 | (ushort)(sVar123 >= sVar106) * sVar106;
  auVar45._0_2_ = (ushort)((short)uVar73 < sVar47) * sVar47 | ((short)uVar73 >= sVar47) * uVar73;
  auVar45._2_2_ = (ushort)((short)uVar77 < sVar49) * sVar49 | ((short)uVar77 >= sVar49) * uVar77;
  auVar45._4_2_ = (ushort)((short)uVar79 < sVar50) * sVar50 | ((short)uVar79 >= sVar50) * uVar79;
  auVar45._6_2_ = (ushort)((short)uVar81 < sVar51) * sVar51 | ((short)uVar81 >= sVar51) * uVar81;
  auVar45._8_2_ = (ushort)((short)uVar83 < sVar56) * sVar56 | ((short)uVar83 >= sVar56) * uVar83;
  auVar45._10_2_ = (ushort)((short)uVar85 < sVar63) * sVar63 | ((short)uVar85 >= sVar63) * uVar85;
  auVar45._12_2_ = (ushort)((short)uVar87 < sVar64) * sVar64 | ((short)uVar87 >= sVar64) * uVar87;
  auVar45._14_2_ = (ushort)((short)uVar89 < sVar65) * sVar65 | ((short)uVar89 >= sVar65) * uVar89;
  paddsw(auVar57,auVar58);
  paddsw(auVar45,auVar58);
  auVar57 = psubusw(local_238,auVar24);
  auVar43 = psubusw(auVar24,local_238);
  auVar43 = auVar43 | auVar57;
  sVar47 = auVar43._0_2_;
  uVar73 = (ushort)(sVar52 < sVar47) * sVar47 | (ushort)(sVar52 >= sVar47) * sVar52;
  sVar47 = auVar43._2_2_;
  uVar77 = (ushort)(sVar53 < sVar47) * sVar47 | (ushort)(sVar53 >= sVar47) * sVar53;
  sVar47 = auVar43._4_2_;
  uVar79 = (ushort)(sVar54 < sVar47) * sVar47 | (ushort)(sVar54 >= sVar47) * sVar54;
  sVar47 = auVar43._6_2_;
  uVar81 = (ushort)(sVar55 < sVar47) * sVar47 | (ushort)(sVar55 >= sVar47) * sVar55;
  sVar47 = auVar43._8_2_;
  uVar83 = (ushort)(sVar59 < sVar47) * sVar47 | (ushort)(sVar59 >= sVar47) * sVar59;
  sVar47 = auVar43._10_2_;
  uVar85 = (ushort)(sVar60 < sVar47) * sVar47 | (ushort)(sVar60 >= sVar47) * sVar60;
  sVar47 = auVar43._12_2_;
  uVar87 = (ushort)(sVar61 < sVar47) * sVar47 | (ushort)(sVar61 >= sVar47) * sVar61;
  sVar47 = auVar43._14_2_;
  uVar89 = (ushort)(sVar62 < sVar47) * sVar47 | (ushort)(sVar62 >= sVar47) * sVar62;
  auVar57 = psubusw(local_228,auVar24);
  auVar43 = psubusw(auVar24,local_228);
  auVar43 = auVar43 | auVar57;
  auVar57 = psllw(_DAT_0050d500,auVar46);
  sVar47 = auVar43._0_2_;
  uVar73 = (sVar47 < (short)uVar73) * uVar73 | (ushort)(sVar47 >= (short)uVar73) * sVar47;
  sVar47 = auVar43._2_2_;
  uVar77 = (sVar47 < (short)uVar77) * uVar77 | (ushort)(sVar47 >= (short)uVar77) * sVar47;
  sVar47 = auVar43._4_2_;
  uVar79 = (sVar47 < (short)uVar79) * uVar79 | (ushort)(sVar47 >= (short)uVar79) * sVar47;
  sVar47 = auVar43._6_2_;
  uVar81 = (sVar47 < (short)uVar81) * uVar81 | (ushort)(sVar47 >= (short)uVar81) * sVar47;
  sVar47 = auVar43._8_2_;
  uVar83 = (sVar47 < (short)uVar83) * uVar83 | (ushort)(sVar47 >= (short)uVar83) * sVar47;
  sVar47 = auVar43._10_2_;
  uVar85 = (sVar47 < (short)uVar85) * uVar85 | (ushort)(sVar47 >= (short)uVar85) * sVar47;
  sVar47 = auVar43._12_2_;
  sVar49 = auVar43._14_2_;
  uVar87 = (sVar47 < (short)uVar87) * uVar87 | (ushort)(sVar47 >= (short)uVar87) * sVar47;
  uVar89 = (sVar49 < (short)uVar89) * uVar89 | (ushort)(sVar49 >= (short)uVar89) * sVar49;
  auVar101._0_2_ =
       ((short)uVar83 < (short)uVar73) * uVar73 | ((short)uVar83 >= (short)uVar73) * uVar83;
  auVar101._2_2_ =
       ((short)uVar85 < (short)uVar77) * uVar77 | ((short)uVar85 >= (short)uVar77) * uVar85;
  auVar101._4_2_ =
       ((short)uVar87 < (short)uVar79) * uVar79 | ((short)uVar87 >= (short)uVar79) * uVar87;
  auVar101._6_2_ =
       ((short)uVar89 < (short)uVar81) * uVar81 | ((short)uVar89 >= (short)uVar81) * uVar89;
  auVar101._8_2_ = (0 < (short)uVar83) * uVar83;
  auVar101._10_2_ = (0 < (short)uVar85) * uVar85;
  auVar101._12_2_ = (0 < (short)uVar87) * uVar87;
  auVar101._14_2_ = (0 < (short)uVar89) * uVar89;
  auVar43 = psubusw(auVar101,auVar57);
  auVar102._0_2_ = -(ushort)(auVar43._0_2_ == 0);
  auVar102._2_2_ = -(ushort)(auVar43._2_2_ == 0);
  auVar102._4_2_ = -(ushort)(auVar43._4_2_ == 0);
  auVar102._6_2_ = -(ushort)(auVar43._6_2_ == 0);
  auVar102._8_2_ = -(ushort)(auVar43._8_2_ == 0);
  auVar102._10_2_ = -(ushort)(auVar43._10_2_ == 0);
  auVar102._12_2_ = -(ushort)(auVar43._12_2_ == 0);
  auVar102._14_2_ = -(ushort)(auVar43._14_2_ == 0);
  auVar102 = auVar102 & auVar95;
  auVar46._0_8_ = auVar102._0_8_;
  auVar46._8_4_ = auVar102._0_4_;
  auVar46._12_4_ = auVar102._4_4_;
  auVar67._0_2_ = -(ushort)(auVar102._0_2_ == 0);
  auVar67._2_2_ = -(ushort)(auVar102._2_2_ == 0);
  auVar67._4_2_ = -(ushort)(auVar102._4_2_ == 0);
  auVar67._6_2_ = -(ushort)(auVar102._6_2_ == 0);
  auVar67._8_2_ = -(ushort)(auVar102._0_2_ == 0);
  auVar67._10_2_ = -(ushort)(auVar102._2_2_ == 0);
  auVar67._12_2_ = -(ushort)(auVar102._4_2_ == 0);
  auVar67._14_2_ = -(ushort)(auVar102._6_2_ == 0);
  if ((ushort)((ushort)(SUB161(auVar67 >> 7,0) & 1) | (ushort)(SUB161(auVar67 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar67 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar67 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar67 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar67 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar67 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar67 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar67 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar67 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar67 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar67 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(auVar67._14_2_ >> 7) & 1) << 0xe | auVar67._14_2_ & 0x8000) != 0xffff
     ) {
    auVar43 = psubusw(local_218,auVar24);
    auVar92 = psubusw(auVar24,local_218);
    auVar92 = auVar92 | auVar43;
    auVar43 = psubusw(local_208,auVar24);
    local_1b8 = local_208;
    auVar72 = psubusw(auVar24,local_208);
    auVar72 = auVar72 | auVar43;
    sVar47 = auVar92._0_2_;
    sVar49 = auVar72._0_2_;
    uVar73 = (ushort)(sVar49 < sVar47) * sVar47 | (ushort)(sVar49 >= sVar47) * sVar49;
    sVar47 = auVar92._2_2_;
    sVar49 = auVar72._2_2_;
    uVar77 = (ushort)(sVar49 < sVar47) * sVar47 | (ushort)(sVar49 >= sVar47) * sVar49;
    sVar47 = auVar92._4_2_;
    sVar49 = auVar72._4_2_;
    uVar79 = (ushort)(sVar49 < sVar47) * sVar47 | (ushort)(sVar49 >= sVar47) * sVar49;
    sVar47 = auVar92._6_2_;
    sVar49 = auVar72._6_2_;
    uVar81 = (ushort)(sVar49 < sVar47) * sVar47 | (ushort)(sVar49 >= sVar47) * sVar49;
    sVar47 = auVar92._8_2_;
    sVar49 = auVar72._8_2_;
    uVar83 = (ushort)(sVar49 < sVar47) * sVar47 | (ushort)(sVar49 >= sVar47) * sVar49;
    sVar47 = auVar92._10_2_;
    sVar49 = auVar72._10_2_;
    uVar85 = (ushort)(sVar49 < sVar47) * sVar47 | (ushort)(sVar49 >= sVar47) * sVar49;
    sVar47 = auVar92._12_2_;
    sVar49 = auVar72._12_2_;
    sVar50 = auVar72._14_2_;
    uVar87 = (ushort)(sVar49 < sVar47) * sVar47 | (ushort)(sVar49 >= sVar47) * sVar49;
    sVar47 = auVar92._14_2_;
    uVar89 = (ushort)(sVar50 < sVar47) * sVar47 | (ushort)(sVar50 >= sVar47) * sVar50;
    auVar92 = psubusw(local_1f8,auVar24);
    auVar43 = psubusw(auVar24,local_1f8);
    auVar43 = auVar43 | auVar92;
    sVar47 = auVar43._0_2_;
    uVar73 = (sVar47 < (short)uVar73) * uVar73 | (ushort)(sVar47 >= (short)uVar73) * sVar47;
    sVar47 = auVar43._2_2_;
    uVar77 = (sVar47 < (short)uVar77) * uVar77 | (ushort)(sVar47 >= (short)uVar77) * sVar47;
    sVar47 = auVar43._4_2_;
    uVar79 = (sVar47 < (short)uVar79) * uVar79 | (ushort)(sVar47 >= (short)uVar79) * sVar47;
    sVar47 = auVar43._6_2_;
    uVar81 = (sVar47 < (short)uVar81) * uVar81 | (ushort)(sVar47 >= (short)uVar81) * sVar47;
    sVar47 = auVar43._8_2_;
    uVar83 = (sVar47 < (short)uVar83) * uVar83 | (ushort)(sVar47 >= (short)uVar83) * sVar47;
    sVar47 = auVar43._10_2_;
    uVar85 = (sVar47 < (short)uVar85) * uVar85 | (ushort)(sVar47 >= (short)uVar85) * sVar47;
    sVar47 = auVar43._12_2_;
    sVar49 = auVar43._14_2_;
    uVar87 = (sVar47 < (short)uVar87) * uVar87 | (ushort)(sVar47 >= (short)uVar87) * sVar47;
    uVar89 = (sVar49 < (short)uVar89) * uVar89 | (ushort)(sVar49 >= (short)uVar89) * sVar49;
    auVar112._0_2_ =
         ((short)uVar83 < (short)uVar73) * uVar73 | ((short)uVar83 >= (short)uVar73) * uVar83;
    auVar112._2_2_ =
         ((short)uVar85 < (short)uVar77) * uVar77 | ((short)uVar85 >= (short)uVar77) * uVar85;
    auVar112._4_2_ =
         ((short)uVar87 < (short)uVar79) * uVar79 | ((short)uVar87 >= (short)uVar79) * uVar87;
    auVar112._6_2_ =
         ((short)uVar89 < (short)uVar81) * uVar81 | ((short)uVar89 >= (short)uVar81) * uVar89;
    auVar112._8_2_ = (0 < (short)uVar83) * uVar83;
    auVar112._10_2_ = (0 < (short)uVar85) * uVar85;
    auVar112._12_2_ = (0 < (short)uVar87) * uVar87;
    auVar112._14_2_ = (0 < (short)uVar89) * uVar89;
    auVar57 = psubusw(auVar112,auVar57);
    auVar113._0_2_ = -(ushort)(auVar57._0_2_ == 0);
    auVar113._2_2_ = -(ushort)(auVar57._2_2_ == 0);
    auVar113._4_2_ = -(ushort)(auVar57._4_2_ == 0);
    auVar113._6_2_ = -(ushort)(auVar57._6_2_ == 0);
    auVar113._8_2_ = -(ushort)(auVar57._8_2_ == 0);
    auVar113._10_2_ = -(ushort)(auVar57._10_2_ == 0);
    auVar113._12_2_ = -(ushort)(auVar57._12_2_ == 0);
    auVar113._14_2_ = -(ushort)(auVar57._14_2_ == 0);
    auVar113 = auVar113 & auVar102;
    sVar47 = local_238._0_2_;
    sVar118 = local_248 + local_258 + sVar47;
    sVar49 = local_238._2_2_;
    sVar121 = sStack_246 + sStack_256 + sVar49;
    sVar50 = local_238._4_2_;
    sVar122 = sStack_244 + sStack_254 + sVar50;
    sVar51 = local_238._6_2_;
    sVar123 = sStack_242 + sStack_252 + sVar51;
    sVar52 = local_238._8_2_;
    sVar124 = sStack_240 + sStack_250 + sVar52;
    sVar53 = local_238._10_2_;
    sVar125 = sStack_23e + sStack_24e + sVar53;
    sVar54 = local_238._12_2_;
    sVar126 = sStack_23c + sStack_24c + sVar54;
    sVar55 = local_238._14_2_;
    sVar127 = sStack_23a + sStack_24a + sVar55;
    sVar103 = sVar124 + sVar118 + 4;
    sVar106 = sVar125 + sVar121 + 4;
    sVar108 = sVar126 + sVar122 + 4;
    sVar110 = sVar127 + sVar123 + 4;
    local_1d8 = local_258;
    sStack_1d6 = sStack_256;
    sStack_1d4 = sStack_254;
    sStack_1d2 = sStack_252;
    sStack_1d0 = sStack_250;
    sStack_1ce = sStack_24e;
    sStack_1cc = sStack_24c;
    sStack_1ca = sStack_24a;
    sVar56 = local_228._0_2_;
    sVar59 = local_228._2_2_;
    sVar60 = local_228._4_2_;
    sVar61 = local_228._6_2_;
    sVar62 = local_228._8_2_;
    sVar63 = local_228._10_2_;
    sVar64 = local_228._12_2_;
    sVar65 = local_228._14_2_;
    local_1c8 = local_b8;
    sStack_1c6 = sStack_b6;
    sStack_1c4 = sStack_b4;
    sStack_1c2 = sStack_b2;
    uStack_1c0 = uStack_b0;
    uStack_1be = uStack_ae;
    uStack_1bc = uStack_ac;
    uStack_1ba = uStack_aa;
    local_1a8 = local_c8;
    sStack_1a6 = sStack_c6;
    sStack_1a4 = sStack_c4;
    sStack_1a2 = sStack_c2;
    uStack_1a0 = uStack_c0;
    uStack_19e = uStack_be;
    uStack_19c = uStack_bc;
    uStack_19a = uStack_ba;
    local_178 = (ushort)(local_258 + sVar56 + sVar103) >> 3;
    uStack_176 = (ushort)(sStack_256 + sVar59 + sVar106) >> 3;
    uStack_174 = (ushort)(sStack_254 + sVar60 + sVar108) >> 3;
    uStack_172 = (ushort)(sStack_252 + sVar61 + sVar110) >> 3;
    uStack_170 = (ushort)(local_e8 + local_b8 + sVar103) >> 3;
    uStack_16e = (ushort)(sStack_e6 + sStack_b6 + sVar106) >> 3;
    uStack_16c = (ushort)(sStack_e4 + sStack_b4 + sVar108) >> 3;
    uStack_16a = (ushort)(sStack_e2 + sStack_b2 + sVar110) >> 3;
    local_168 = (ushort)((sVar103 - local_c8) + local_248 + sVar56 * 2) >> 3;
    uStack_166 = (ushort)((sVar106 - sStack_c6) + sStack_246 + sVar59 * 2) >> 3;
    uStack_164 = (ushort)((sVar108 - sStack_c4) + sStack_244 + sVar60 * 2) >> 3;
    uStack_162 = (ushort)((sVar110 - sStack_c2) + sStack_242 + sVar61 * 2) >> 3;
    uStack_160 = (ushort)((sVar103 - sVar47) + sStack_240 + sVar62 * 2) >> 3;
    uStack_15e = (ushort)((sVar106 - sVar49) + sStack_23e + sVar63 * 2) >> 3;
    uStack_15c = (ushort)((sVar108 - sVar50) + sStack_23c + sVar64 * 2) >> 3;
    uStack_15a = (ushort)((sVar110 - sVar51) + sStack_23a + sVar65 * 2) >> 3;
    local_188 = local_238;
    local_198 = local_248;
    sStack_196 = sStack_246;
    sStack_194 = sStack_244;
    sStack_192 = sStack_242;
    sStack_190 = sStack_240;
    sStack_18e = sStack_23e;
    sStack_18c = sStack_23c;
    sStack_18a = sStack_23a;
    local_158 = (ushort)(((sVar103 - local_c8) + sVar47 + sVar56 * 3) - local_d8) >> 3;
    uStack_156 = (ushort)(((sVar106 - sStack_c6) + sVar49 + sVar59 * 3) - sStack_d6) >> 3;
    uStack_154 = (ushort)(((sVar108 - sStack_c4) + sVar50 + sVar60 * 3) - sStack_d4) >> 3;
    uStack_152 = (ushort)(((sVar110 - sStack_c2) + sVar51 + sVar61 * 3) - sStack_d2) >> 3;
    uStack_150 = (ushort)(((sVar52 + sVar62 * 3) - local_248) + (sVar103 - sVar47)) >> 3;
    uStack_14e = (ushort)(((sVar53 + sVar63 * 3) - sStack_246) + (sVar106 - sVar49)) >> 3;
    uStack_14c = (ushort)(((sVar54 + sVar64 * 3) - sStack_244) + (sVar108 - sVar50)) >> 3;
    uStack_14a = (ushort)(((sVar55 + sVar65 * 3) - sStack_242) + (sVar110 - sVar51)) >> 3;
    auVar66._0_8_ = auVar113._0_8_;
    auVar66._8_4_ = auVar113._0_4_;
    auVar66._12_4_ = auVar113._4_4_;
    auVar76._0_2_ = -(ushort)(auVar113._0_2_ == 0);
    auVar76._2_2_ = -(ushort)(auVar113._2_2_ == 0);
    auVar76._4_2_ = -(ushort)(auVar113._4_2_ == 0);
    auVar76._6_2_ = -(ushort)(auVar113._6_2_ == 0);
    auVar76._8_2_ = -(ushort)(auVar113._0_2_ == 0);
    auVar76._10_2_ = -(ushort)(auVar113._2_2_ == 0);
    auVar76._12_2_ = -(ushort)(auVar113._4_2_ == 0);
    auVar76._14_2_ = -(ushort)(auVar113._6_2_ == 0);
    uVar73 = ((ushort)(SUB161(auVar76 >> 7,0) & 1) | (ushort)(SUB161(auVar76 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar76 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar76 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar76 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar76 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar76 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar76 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar76 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar76 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar76 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar76 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar76 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar76 >> 0x6f,0) & 1) << 0xd |
              (ushort)((byte)(auVar76._14_2_ >> 7) & 1) << 0xe | auVar76._14_2_ & 0x8000) ^ 0xffff;
    if (uVar73 != 0) {
      local_268 = local_218._0_2_;
      sStack_266 = local_218._2_2_;
      sStack_264 = local_218._4_2_;
      sStack_262 = local_218._6_2_;
      sStack_260 = local_218._8_2_;
      sStack_25e = local_218._10_2_;
      sStack_25c = local_218._12_2_;
      sStack_25a = local_218._14_2_;
      local_1b8._0_2_ = local_208._0_2_;
      local_1b8._2_2_ = local_208._2_2_;
      local_1b8._4_2_ = local_208._4_2_;
      local_1b8._6_2_ = local_208._6_2_;
      local_1b8._8_2_ = local_208._8_2_;
      local_1b8._10_2_ = local_208._10_2_;
      local_1b8._12_2_ = local_208._12_2_;
      local_1b8._14_2_ = local_208._14_2_;
      sVar74 = local_268 + local_1b8._0_2_ + sVar56;
      sVar78 = sStack_266 + local_1b8._2_2_ + sVar59;
      sVar80 = sStack_264 + local_1b8._4_2_ + sVar60;
      sVar82 = sStack_262 + local_1b8._6_2_ + sVar61;
      sVar84 = sStack_260 + local_1b8._8_2_ + sVar62;
      sVar86 = sStack_25e + local_1b8._10_2_ + sVar63;
      sVar88 = sStack_25c + local_1b8._12_2_ + sVar64;
      sVar90 = sStack_25a + local_1b8._14_2_ + sVar65;
      local_1e8 = local_d8;
      sStack_1e6 = sStack_d6;
      sStack_1e4 = sStack_d4;
      sStack_1e2 = sStack_d2;
      uStack_1e0 = uStack_d0;
      uStack_1de = uStack_ce;
      uStack_1dc = uStack_cc;
      uStack_1da = uStack_ca;
      sVar104 = sVar84 + sVar124 + sVar74 + sVar118 + 8;
      sVar107 = sVar86 + sVar125 + sVar78 + sVar121 + 8;
      sVar109 = sVar88 + sVar126 + sVar80 + sVar122 + 8;
      sVar111 = sVar90 + sVar127 + sVar82 + sVar123 + 8;
      sVar103 = local_1f8._0_2_;
      sVar106 = local_1f8._2_2_;
      sVar108 = local_1f8._4_2_;
      sVar110 = local_1f8._6_2_;
      sVar68 = local_1f8._8_2_;
      sVar69 = local_1f8._10_2_;
      sVar70 = local_1f8._12_2_;
      sVar71 = local_1f8._14_2_;
      local_148 = (ushort)(sVar104 + local_e8 + local_248 + local_258 + sVar103) >> 4;
      uStack_146 = (ushort)(sVar107 + sStack_e6 + sStack_246 + sStack_256 + sVar106) >> 4;
      uStack_144 = (ushort)(sVar109 + sStack_e4 + sStack_244 + sStack_254 + sVar108) >> 4;
      uStack_142 = (ushort)(sVar111 + sStack_e2 + sStack_242 + sStack_252 + sVar110) >> 4;
      uStack_140 = (ushort)(sStack_240 + sStack_250 + sVar68 + local_258 + sVar104) >> 4;
      uStack_13e = (ushort)(sStack_23e + sStack_24e + sVar69 + sStack_256 + sVar107) >> 4;
      uStack_13c = (ushort)(sStack_23c + sStack_24c + sVar70 + sStack_254 + sVar109) >> 4;
      uStack_13a = (ushort)(sStack_23a + sStack_24a + sVar71 + sStack_252 + sVar111) >> 4;
      local_138 = (ushort)((sVar104 - local_98) + sVar118 + sVar103 * 2) >> 4;
      uStack_136 = (ushort)((sVar107 - sStack_96) + sVar121 + sVar106 * 2) >> 4;
      uStack_134 = (ushort)((sVar109 - sStack_94) + sVar122 + sVar108 * 2) >> 4;
      uStack_132 = (ushort)((sVar111 - sStack_92) + sVar123 + sVar110 * 2) >> 4;
      uStack_130 = (ushort)((sVar104 - local_1b8._0_2_) + sVar124 + sVar68 * 2) >> 4;
      uStack_12e = (ushort)((sVar107 - local_1b8._2_2_) + sVar125 + sVar69 * 2) >> 4;
      uStack_12c = (ushort)((sVar109 - local_1b8._4_2_) + sVar126 + sVar70 * 2) >> 4;
      uStack_12a = (ushort)((sVar111 - local_1b8._6_2_) + sVar127 + sVar71 * 2) >> 4;
      sVar124 = (sVar104 - local_98) - local_a8;
      sVar125 = (sVar107 - sStack_96) - sStack_a6;
      sVar126 = (sVar109 - sStack_94) - sStack_a4;
      sVar127 = (sVar111 - sStack_92) - sStack_a2;
      sVar118 = (sVar104 - local_1b8._0_2_) - local_268;
      sVar121 = (sVar107 - local_1b8._2_2_) - sStack_266;
      sVar122 = (sVar109 - local_1b8._4_2_) - sStack_264;
      sVar123 = (sVar111 - local_1b8._6_2_) - sStack_262;
      local_128 = (ushort)(sVar124 + local_248 + sVar47 + sVar56 + sVar103 * 3) >> 4;
      uStack_126 = (ushort)(sVar125 + sStack_246 + sVar49 + sVar59 + sVar106 * 3) >> 4;
      uStack_124 = (ushort)(sVar126 + sStack_244 + sVar50 + sVar60 + sVar108 * 3) >> 4;
      uStack_122 = (ushort)(sVar127 + sStack_242 + sVar51 + sVar61 + sVar110 * 3) >> 4;
      uStack_120 = (ushort)(sVar118 + sStack_240 + sVar52 + sVar62 + sVar68 * 3) >> 4;
      uStack_11e = (ushort)(sVar121 + sStack_23e + sVar53 + sVar63 + sVar69 * 3) >> 4;
      uStack_11c = (ushort)(sVar122 + sStack_23c + sVar54 + sVar64 + sVar70 * 3) >> 4;
      uStack_11a = (ushort)(sVar123 + sStack_23a + sVar55 + sVar65 + sVar71 * 3) >> 4;
      sVar124 = sVar124 - local_b8;
      sVar125 = sVar125 - sStack_b6;
      sVar126 = sVar126 - sStack_b4;
      sVar127 = sVar127 - sStack_b2;
      auVar57 = psllw(local_1f8,2);
      sVar118 = sVar118 - sVar56;
      sVar121 = sVar121 - sVar59;
      sVar122 = sVar122 - sVar60;
      sVar123 = sVar123 - sVar61;
      local_118 = (ushort)(sVar124 + sVar56 + local_268 + sVar47 + auVar57._0_2_) >> 4;
      uStack_116 = (ushort)(sVar125 + sVar59 + sStack_266 + sVar49 + auVar57._2_2_) >> 4;
      uStack_114 = (ushort)(sVar126 + sVar60 + sStack_264 + sVar50 + auVar57._4_2_) >> 4;
      uStack_112 = (ushort)(sVar127 + sVar61 + sStack_262 + sVar51 + auVar57._6_2_) >> 4;
      uStack_110 = (ushort)(sVar118 + sVar62 + sStack_260 + sVar52 + auVar57._8_2_) >> 4;
      uStack_10e = (ushort)(sVar121 + sVar63 + sStack_25e + sVar53 + auVar57._10_2_) >> 4;
      uStack_10c = (ushort)(sVar122 + sVar64 + sStack_25c + sVar54 + auVar57._12_2_) >> 4;
      uStack_10a = (ushort)(sVar123 + sVar65 + sStack_25a + sVar55 + auVar57._14_2_) >> 4;
      sVar124 = sVar124 - local_c8;
      sVar125 = sVar125 - sStack_c6;
      sVar126 = sVar126 - sStack_c4;
      sVar127 = sVar127 - sStack_c2;
      sVar118 = sVar118 - sVar47;
      sVar121 = sVar121 - sVar49;
      sVar122 = sVar122 - sVar50;
      sVar123 = sVar123 - sVar51;
      local_108 = (ushort)(sVar124 + auVar57._0_2_ + sVar103 + sVar74) >> 4;
      uStack_106 = (ushort)(sVar125 + auVar57._2_2_ + sVar106 + sVar78) >> 4;
      uStack_104 = (ushort)(sVar126 + auVar57._4_2_ + sVar108 + sVar80) >> 4;
      uStack_102 = (ushort)(sVar127 + auVar57._6_2_ + sVar110 + sVar82) >> 4;
      uStack_100 = (ushort)(sVar118 + auVar57._8_2_ + sVar68 + sVar84) >> 4;
      uStack_fe = (ushort)(sVar121 + auVar57._10_2_ + sVar69 + sVar86) >> 4;
      uStack_fc = (ushort)(sVar122 + auVar57._12_2_ + sVar70 + sVar88) >> 4;
      uStack_fa = (ushort)(sVar123 + auVar57._14_2_ + sVar71 + sVar90) >> 4;
      local_f8 = (ushort)(((local_268 + local_1b8._0_2_ + sVar103 * 7) - local_d8) + sVar124) >> 4;
      uStack_f6 = (ushort)(((sStack_266 + local_1b8._2_2_ + sVar106 * 7) - sStack_d6) + sVar125) >>
                  4;
      uStack_f4 = (ushort)(((sStack_264 + local_1b8._4_2_ + sVar108 * 7) - sStack_d4) + sVar126) >>
                  4;
      uStack_f2 = (ushort)(((sStack_262 + local_1b8._6_2_ + sVar110 * 7) - sStack_d2) + sVar127) >>
                  4;
      uStack_f0 = (ushort)(((sStack_260 + local_1b8._8_2_ + sVar68 * 7) - local_248) + sVar118) >> 4
      ;
      uStack_ee = (ushort)(((sStack_25e + local_1b8._10_2_ + sVar69 * 7) - sStack_246) + sVar121) >>
                  4;
      uStack_ec = (ushort)(((sStack_25c + local_1b8._12_2_ + sVar70 * 7) - sStack_244) + sVar122) >>
                  4;
      uStack_ea = (ushort)(((sStack_25a + local_1b8._14_2_ + sVar71 * 7) - sStack_242) + sVar123) >>
                  4;
    }
    auVar41._8_4_ = 0xffffffff;
    auVar41._0_8_ = 0xffffffffffffffff;
    auVar41._12_4_ = 0xffffffff;
    uVar37 = (ulong)(uint)(0 << bVar1);
    do {
      auVar57 = *(undefined1 (*) [16])((long)&local_178 + uVar37) & auVar46;
      *(undefined1 (*) [16])((long)&local_178 + uVar37) = auVar57;
      *(undefined1 (*) [16])((long)&local_258 + uVar37) =
           auVar57 | *(undefined1 (*) [16])((long)&local_258 + uVar37) & (auVar41 ^ auVar46);
      uVar37 = uVar37 + 0x10;
    } while (uVar37 != 0x30);
    if (uVar73 != 0) {
      auVar42._8_4_ = 0xffffffff;
      auVar42._0_8_ = 0xffffffffffffffff;
      auVar42._12_4_ = 0xffffffff;
      lVar39 = 0;
      do {
        auVar57 = *(undefined1 (*) [16])((long)&local_148 + lVar39) & auVar66;
        *(undefined1 (*) [16])((long)&local_148 + lVar39) = auVar57;
        *(undefined1 (*) [16])((long)&local_258 + lVar39) =
             auVar57 | *(undefined1 (*) [16])((long)&local_258 + lVar39) & (auVar42 ^ auVar66);
        lVar39 = lVar39 + 0x10;
      } while (lVar39 != 0x60);
    }
  }
  puVar36 = s + -lVar35;
  lVar39 = 0;
  do {
    uVar23 = *(undefined8 *)((long)&sStack_250 + lVar39);
    *(undefined8 *)puVar36 = *(undefined8 *)((long)&local_258 + lVar39);
    *(undefined8 *)s = uVar23;
    puVar36 = puVar36 + -lVar35;
    s = s + lVar35;
    lVar39 = lVar39 + 0x10;
  } while (lVar39 != 0x60);
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_14_sse2(uint16_t *s, int pitch,
                                       const uint8_t *blimit,
                                       const uint8_t *limit,
                                       const uint8_t *thresh, int bd) {
  __m128i p[7], q[7], pq[7];
  int i;

  for (i = 0; i < 7; i++) {
    p[i] = _mm_loadl_epi64((__m128i *)(s - (i + 1) * pitch));
    q[i] = _mm_loadl_epi64((__m128i *)(s + i * pitch));
  }

  highbd_lpf_internal_14_sse2(p, q, pq, blimit, limit, thresh, bd);

  for (i = 0; i < 6; i++) {
    _mm_storel_epi64((__m128i *)(s - (i + 1) * pitch), pq[i]);
    _mm_storel_epi64((__m128i *)(s + i * pitch), _mm_srli_si128(pq[i], 8));
  }
}